

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiFeatureInfo.cpp
# Opt level: O2

TestStatus *
vkt::api::anon_unknown_0::testCompressedFormatsSupported
          (TestStatus *__return_storage_ptr__,Context *context)

{
  ostringstream *poVar1;
  VkFormat *pVVar2;
  TestStatus *__return_storage_ptr___00;
  bool bVar3;
  int iVar4;
  long lVar5;
  char *pcVar6;
  VkFormat *cur;
  VkFormat *pVVar7;
  ostringstream *poVar8;
  allocator<char> local_1ed;
  int local_1ec;
  TestLog *local_1e8;
  int local_1e0;
  int local_1dc;
  char *local_1d8;
  char *local_1d0;
  TestStatus *local_1c8;
  VkPhysicalDeviceFeatures *local_1c0;
  long local_1b8;
  MessageBuilder local_1b0;
  
  local_1e8 = context->m_testCtx->m_log;
  local_1c8 = __return_storage_ptr__;
  local_1c0 = Context::getDeviceFeatures(context);
  poVar1 = &local_1b0.m_str;
  lVar5 = 0;
  local_1e0 = 0;
  local_1ec = 0;
  local_1dc = 0;
  do {
    if (lVar5 == 3) {
      iVar4 = local_1ec;
      if (local_1dc == 0) {
        poVar1 = &local_1b0.m_str;
        local_1b0.m_log = local_1e8;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
        std::operator<<((ostream *)poVar1,"No compressed format sets supported");
        tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
        iVar4 = local_1ec + 1;
      }
      __return_storage_ptr___00 = local_1c8;
      if (iVar4 < 1) {
        if (local_1e0 < 1) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1b0,"Compressed texture format support is valid",&local_1ed);
          tcu::TestStatus::pass(__return_storage_ptr___00,(string *)&local_1b0);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1b0,"Found inconsistencies in compressed format support",
                     &local_1ed);
          __return_storage_ptr___00->m_code = QP_TEST_RESULT_QUALITY_WARNING;
          std::__cxx11::string::string
                    ((string *)&__return_storage_ptr___00->m_description,(string *)&local_1b0);
        }
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1b0,"Compressed format support not valid",&local_1ed);
        tcu::TestStatus::fail(__return_storage_ptr___00,(string *)&local_1b0);
      }
      std::__cxx11::string::~string((string *)&local_1b0);
      return __return_storage_ptr___00;
    }
    local_1d8 = testCompressedFormatsSupported::s_compressedFormatSets[lVar5].setName;
    local_1d0 = testCompressedFormatsSupported::s_compressedFormatSets[lVar5].featureName;
    iVar4 = *(int *)((long)&local_1c0->robustBufferAccess +
                    testCompressedFormatsSupported::s_compressedFormatSets[lVar5].feature);
    pVVar7 = testCompressedFormatsSupported::s_compressedFormatSets[lVar5].formatsBegin;
    pVVar2 = testCompressedFormatsSupported::s_compressedFormatSets[lVar5].formatsEnd;
    local_1b8 = lVar5;
    do {
      if (pVVar7 == pVVar2) {
        pcVar6 = local_1d8;
        if (iVar4 == 1) goto LAB_004a6036;
        local_1b0.m_log = local_1e8;
        poVar8 = &local_1b0.m_str;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar8);
        std::operator<<((ostream *)poVar8,"WARNING: ");
        pcVar6 = local_1d8;
        std::operator<<((ostream *)poVar8,local_1d8);
        std::operator<<((ostream *)poVar8," formats supported but ");
        std::operator<<((ostream *)poVar8,local_1d0);
        std::operator<<((ostream *)poVar8," = VK_FALSE");
        tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar8);
        local_1e0 = local_1e0 + 1;
        goto LAB_004a611b;
      }
      bVar3 = optimalTilingFeaturesSupported(context,*pVVar7,1);
      pVVar7 = pVVar7 + 1;
    } while (bVar3);
    pcVar6 = local_1d8;
    if (iVar4 == 1) {
      local_1b0.m_log = local_1e8;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
      std::operator<<((ostream *)poVar1,"ERROR: ");
      pcVar6 = local_1d8;
      std::operator<<((ostream *)poVar1,local_1d0);
      std::operator<<((ostream *)poVar1," = VK_TRUE but ");
      std::operator<<((ostream *)poVar1,pcVar6);
      std::operator<<((ostream *)poVar1," formats not supported");
      tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
      local_1ec = local_1ec + 1;
LAB_004a6036:
      poVar8 = &local_1b0.m_str;
      local_1b0.m_log = local_1e8;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar8);
      std::operator<<((ostream *)poVar8,"All ");
      std::operator<<((ostream *)poVar8,pcVar6);
      std::operator<<((ostream *)poVar8," formats are supported");
      tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar8);
      local_1dc = local_1dc + 1;
    }
    else {
LAB_004a611b:
      local_1b0.m_log = local_1e8;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0.m_str);
      std::operator<<((ostream *)&local_1b0.m_str,pcVar6);
      std::operator<<((ostream *)&local_1b0.m_str," formats are not supported");
      tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1b0.m_str);
    }
    lVar5 = local_1b8 + 1;
  } while( true );
}

Assistant:

tcu::TestStatus testCompressedFormatsSupported (Context& context)
{
	static const VkFormat s_allBcFormats[] =
	{
		VK_FORMAT_BC1_RGB_UNORM_BLOCK,
		VK_FORMAT_BC1_RGB_SRGB_BLOCK,
		VK_FORMAT_BC1_RGBA_UNORM_BLOCK,
		VK_FORMAT_BC1_RGBA_SRGB_BLOCK,
		VK_FORMAT_BC2_UNORM_BLOCK,
		VK_FORMAT_BC2_SRGB_BLOCK,
		VK_FORMAT_BC3_UNORM_BLOCK,
		VK_FORMAT_BC3_SRGB_BLOCK,
		VK_FORMAT_BC4_UNORM_BLOCK,
		VK_FORMAT_BC4_SNORM_BLOCK,
		VK_FORMAT_BC5_UNORM_BLOCK,
		VK_FORMAT_BC5_SNORM_BLOCK,
		VK_FORMAT_BC6H_UFLOAT_BLOCK,
		VK_FORMAT_BC6H_SFLOAT_BLOCK,
		VK_FORMAT_BC7_UNORM_BLOCK,
		VK_FORMAT_BC7_SRGB_BLOCK,
	};
	static const VkFormat s_allEtc2Formats[] =
	{
		VK_FORMAT_ETC2_R8G8B8_UNORM_BLOCK,
		VK_FORMAT_ETC2_R8G8B8_SRGB_BLOCK,
		VK_FORMAT_ETC2_R8G8B8A1_UNORM_BLOCK,
		VK_FORMAT_ETC2_R8G8B8A1_SRGB_BLOCK,
		VK_FORMAT_ETC2_R8G8B8A8_UNORM_BLOCK,
		VK_FORMAT_ETC2_R8G8B8A8_SRGB_BLOCK,
		VK_FORMAT_EAC_R11_UNORM_BLOCK,
		VK_FORMAT_EAC_R11_SNORM_BLOCK,
		VK_FORMAT_EAC_R11G11_UNORM_BLOCK,
		VK_FORMAT_EAC_R11G11_SNORM_BLOCK,
	};
	static const VkFormat s_allAstcLdrFormats[] =
	{
		VK_FORMAT_ASTC_4x4_UNORM_BLOCK,
		VK_FORMAT_ASTC_4x4_SRGB_BLOCK,
		VK_FORMAT_ASTC_5x4_UNORM_BLOCK,
		VK_FORMAT_ASTC_5x4_SRGB_BLOCK,
		VK_FORMAT_ASTC_5x5_UNORM_BLOCK,
		VK_FORMAT_ASTC_5x5_SRGB_BLOCK,
		VK_FORMAT_ASTC_6x5_UNORM_BLOCK,
		VK_FORMAT_ASTC_6x5_SRGB_BLOCK,
		VK_FORMAT_ASTC_6x6_UNORM_BLOCK,
		VK_FORMAT_ASTC_6x6_SRGB_BLOCK,
		VK_FORMAT_ASTC_8x5_UNORM_BLOCK,
		VK_FORMAT_ASTC_8x5_SRGB_BLOCK,
		VK_FORMAT_ASTC_8x6_UNORM_BLOCK,
		VK_FORMAT_ASTC_8x6_SRGB_BLOCK,
		VK_FORMAT_ASTC_8x8_UNORM_BLOCK,
		VK_FORMAT_ASTC_8x8_SRGB_BLOCK,
		VK_FORMAT_ASTC_10x5_UNORM_BLOCK,
		VK_FORMAT_ASTC_10x5_SRGB_BLOCK,
		VK_FORMAT_ASTC_10x6_UNORM_BLOCK,
		VK_FORMAT_ASTC_10x6_SRGB_BLOCK,
		VK_FORMAT_ASTC_10x8_UNORM_BLOCK,
		VK_FORMAT_ASTC_10x8_SRGB_BLOCK,
		VK_FORMAT_ASTC_10x10_UNORM_BLOCK,
		VK_FORMAT_ASTC_10x10_SRGB_BLOCK,
		VK_FORMAT_ASTC_12x10_UNORM_BLOCK,
		VK_FORMAT_ASTC_12x10_SRGB_BLOCK,
		VK_FORMAT_ASTC_12x12_UNORM_BLOCK,
		VK_FORMAT_ASTC_12x12_SRGB_BLOCK,
	};

	static const struct
	{
		const char*									setName;
		const char*									featureName;
		const VkBool32 VkPhysicalDeviceFeatures::*	feature;
		const VkFormat*								formatsBegin;
		const VkFormat*								formatsEnd;
	} s_compressedFormatSets[] =
	{
		{ "BC",			"textureCompressionBC",			&VkPhysicalDeviceFeatures::textureCompressionBC,		DE_ARRAY_BEGIN(s_allBcFormats),			DE_ARRAY_END(s_allBcFormats)		},
		{ "ETC2",		"textureCompressionETC2",		&VkPhysicalDeviceFeatures::textureCompressionETC2,		DE_ARRAY_BEGIN(s_allEtc2Formats),		DE_ARRAY_END(s_allEtc2Formats)		},
		{ "ASTC LDR",	"textureCompressionASTC_LDR",	&VkPhysicalDeviceFeatures::textureCompressionASTC_LDR,	DE_ARRAY_BEGIN(s_allAstcLdrFormats),	DE_ARRAY_END(s_allAstcLdrFormats)	},
	};

	TestLog&						log					= context.getTestContext().getLog();
	const VkPhysicalDeviceFeatures&	features			= context.getDeviceFeatures();
	int								numSupportedSets	= 0;
	int								numErrors			= 0;
	int								numWarnings			= 0;

	for (int setNdx = 0; setNdx < DE_LENGTH_OF_ARRAY(s_compressedFormatSets); ++setNdx)
	{
		const char* const	setName			= s_compressedFormatSets[setNdx].setName;
		const char* const	featureName		= s_compressedFormatSets[setNdx].featureName;
		const bool			featureBitSet	= features.*s_compressedFormatSets[setNdx].feature == VK_TRUE;
		const bool			allSupported	= optimalTilingFeaturesSupportedForAll(context,
																				   s_compressedFormatSets[setNdx].formatsBegin,
																				   s_compressedFormatSets[setNdx].formatsEnd,
																				   VK_FORMAT_FEATURE_SAMPLED_IMAGE_BIT);

		if (featureBitSet && !allSupported)
		{
			log << TestLog::Message << "ERROR: " << featureName << " = VK_TRUE but " << setName << " formats not supported" << TestLog::EndMessage;
			numErrors += 1;
		}
		else if (allSupported && !featureBitSet)
		{
			log << TestLog::Message << "WARNING: " << setName << " formats supported but " << featureName << " = VK_FALSE" << TestLog::EndMessage;
			numWarnings += 1;
		}

		if (featureBitSet)
		{
			log << TestLog::Message << "All " << setName << " formats are supported" << TestLog::EndMessage;
			numSupportedSets += 1;
		}
		else
			log << TestLog::Message << setName << " formats are not supported" << TestLog::EndMessage;
	}

	if (numSupportedSets == 0)
	{
		log << TestLog::Message << "No compressed format sets supported" << TestLog::EndMessage;
		numErrors += 1;
	}

	if (numErrors > 0)
		return tcu::TestStatus::fail("Compressed format support not valid");
	else if (numWarnings > 0)
		return tcu::TestStatus(QP_TEST_RESULT_QUALITY_WARNING, "Found inconsistencies in compressed format support");
	else
		return tcu::TestStatus::pass("Compressed texture format support is valid");
}